

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

Query * q_min_of(uint32_t count,vector<Query,_std::allocator<Query>_> *queries)

{
  undefined4 in_ESI;
  Query *in_RDI;
  Query *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  Query::Query(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20),
               (vector<Query,_std::allocator<Query>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return in_RDI;
}

Assistant:

Query q_min_of(uint32_t count, std::vector<Query> &&queries) {
    return Query(count, std::move(queries));
}